

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O3

IEventListenerPtr __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory::create
          (TypedListenerFactory *this,IConfig *config)

{
  _func_int **pp_Var1;
  _func_int *in_RDX;
  
  pp_Var1 = (_func_int **)operator_new(0x70);
  *(undefined2 *)(pp_Var1 + 1) = 0;
  pp_Var1[2] = in_RDX;
  *pp_Var1 = (_func_int *)&PTR__Catch2ApprovalListener_001aad30;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)(pp_Var1 + 8);
  pp_Var1[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 8) = 0;
  pp_Var1[10] = (_func_int *)(pp_Var1 + 0xc);
  pp_Var1[0xb] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0xc) = 0;
  (this->super_EventListenerFactory)._vptr_EventListenerFactory = pp_Var1;
  return (IEventListenerPtr)(IEventListener *)this;
}

Assistant:

IEventListenerPtr create( IConfig const* config ) const override {
                return Detail::make_unique<T>( config );
            }